

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

CURLcode Curl_hsts_save(Curl_easy *data,hsts *h,char *file)

{
  void *pvVar1;
  FILE *whereto;
  hsts *phVar2;
  CURLcode CVar3;
  int iVar4;
  CURLSTScode CVar5;
  char *pcVar6;
  Curl_llist_element *pCVar7;
  char *tempstore;
  FILE *out;
  char *local_b0;
  hsts *local_a8;
  curl_index i;
  tm local_90;
  curl_hstsentry e;
  
  tempstore = (char *)0x0;
  if (h == (hsts *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    if (file == (char *)0x0) {
      file = h->filename;
    }
    CVar3 = CURLE_OK;
    if (((file != (char *)0x0) && ((h->flags & 2) == 0)) && (*file != '\0')) {
      CVar3 = Curl_fopen(data,file,&out,&tempstore);
      if (CVar3 == CURLE_OK) {
        fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n# This file was generated by libcurl! Edit at your own risk.\n"
              ,(FILE *)out);
        pCVar7 = (h->list).head;
        pcVar6 = file;
        phVar2 = h;
        if (pCVar7 == (Curl_llist_element *)0x0) {
          CVar3 = CURLE_OK;
        }
        else {
          do {
            local_a8 = phVar2;
            local_b0 = pcVar6;
            whereto = out;
            pvVar1 = pCVar7->ptr;
            pCVar7 = pCVar7->next;
            if (*(long *)((long)pvVar1 + 0x28) == 0x7fffffffffffffff) {
              pcVar6 = "";
              if (*(char *)((long)pvVar1 + 0x20) != '\0') {
                pcVar6 = ".";
              }
              curl_mfprintf(out,"%s%s \"%s\"\n",pcVar6,*(undefined8 *)((long)pvVar1 + 0x18),
                            "unlimited");
            }
            else {
              CVar3 = Curl_gmtime(*(long *)((long)pvVar1 + 0x28),&local_90);
              h = local_a8;
              file = local_b0;
              if (CVar3 != CURLE_OK) goto LAB_0066e8b4;
              pcVar6 = "";
              if (*(char *)((long)pvVar1 + 0x20) != '\0') {
                pcVar6 = ".";
              }
              curl_mfprintf(whereto,"%s%s \"%d%02d%02d %02d:%02d:%02d\"\n",pcVar6,
                            *(undefined8 *)((long)pvVar1 + 0x18),(ulong)(local_90.tm_year + 0x76c),
                            (ulong)(local_90.tm_mon + 1),(ulong)(uint)local_90.tm_mday,
                            (ulong)(uint)local_90.tm_hour,(ulong)(uint)local_90.tm_min,
                            (ulong)(uint)local_90.tm_sec);
            }
            pcVar6 = local_b0;
            phVar2 = local_a8;
          } while (pCVar7 != (Curl_llist_element *)0x0);
          CVar3 = CURLE_OK;
          h = local_a8;
          file = local_b0;
        }
LAB_0066e8b4:
        fclose((FILE *)out);
        if (tempstore != (char *)0x0 && CVar3 == CURLE_OK) {
          iVar4 = Curl_rename(tempstore,file);
          CVar3 = CURLE_WRITE_ERROR;
          if (iVar4 == 0) {
            CVar3 = CURLE_OK;
          }
        }
        if (tempstore != (char *)0x0 && CVar3 != CURLE_OK) {
          unlink(tempstore);
        }
      }
      (*Curl_cfree)(tempstore);
    }
    if ((data->set).hsts_write != (curl_hstswrite_callback)0x0) {
      i.total = (h->list).size;
      i.index = 0;
      pCVar7 = (h->list).head;
      if (pCVar7 != (Curl_llist_element *)0x0) {
        while( true ) {
          pvVar1 = pCVar7->ptr;
          pCVar7 = pCVar7->next;
          e.name = *(char **)((long)pvVar1 + 0x18);
          e.namelen = strlen(e.name);
          e._16_1_ = *(undefined1 *)((long)pvVar1 + 0x20);
          if (*(long *)((long)pvVar1 + 0x28) == 0x7fffffffffffffff) {
            builtin_strncpy(e.expire,"unlimited",10);
          }
          else {
            CVar3 = Curl_gmtime(*(long *)((long)pvVar1 + 0x28),&local_90);
            if (CVar3 != CURLE_OK) {
              return CVar3;
            }
            curl_msnprintf(e.expire,0x12,"%d%02d%02d %02d:%02d:%02d",
                           (ulong)(local_90.tm_year + 0x76c),(ulong)(local_90.tm_mon + 1),
                           (ulong)(uint)local_90.tm_mday,(ulong)(uint)local_90.tm_hour,
                           (ulong)(uint)local_90.tm_min,(ulong)(uint)local_90.tm_sec);
          }
          CVar5 = (*(data->set).hsts_write)(data,&e,&i,(data->set).hsts_write_userp);
          if (CVar5 == CURLSTS_FAIL) break;
          if (CVar5 != CURLSTS_OK) {
            return CURLE_OK;
          }
          i.index = i.index + 1;
          if (pCVar7 == (Curl_llist_element *)0x0) {
            return CURLE_OK;
          }
        }
        CVar3 = CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_hsts_save(struct Curl_easy *data, struct hsts *h,
                        const char *file)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  CURLcode result = CURLE_OK;
  FILE *out;
  char *tempstore = NULL;

  if(!h)
    /* no cache activated */
    return CURLE_OK;

  /* if no new name is given, use the one we stored from the load */
  if(!file && h->filename)
    file = h->filename;

  if((h->flags & CURLHSTS_READONLYFILE) || !file || !file[0])
    /* marked as read-only, no file or zero length file name */
    goto skipsave;

  result = Curl_fopen(data, file, &out, &tempstore);
  if(!result) {
    fputs("# Your HSTS cache. https://curl.se/docs/hsts.html\n"
          "# This file was generated by libcurl! Edit at your own risk.\n",
          out);
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      result = hsts_out(sts, out);
      if(result)
        break;
    }
    fclose(out);
    if(!result && tempstore && Curl_rename(tempstore, file))
      result = CURLE_WRITE_ERROR;

    if(result && tempstore)
      unlink(tempstore);
  }
  free(tempstore);
skipsave:
  if(data->set.hsts_write) {
    /* if there's a write callback */
    struct curl_index i; /* count */
    i.total = h->list.size;
    i.index = 0;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      bool stop;
      n = e->next;
      result = hsts_push(data, &i, sts, &stop);
      if(result || stop)
        break;
      i.index++;
    }
  }
  return result;
}